

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O3

HighsStatus __thiscall
Highs::getBasisInverseRowSparse(Highs *this,HighsInt row,HVector *row_ep_buffer)

{
  HEkk::setNlaPointersForLpAndScale(&this->ekk_instance_,&(this->model_).lp_);
  HVectorBase<double>::clear(row_ep_buffer);
  row_ep_buffer->count = 1;
  *(row_ep_buffer->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
   super__Vector_impl_data._M_start = row;
  (row_ep_buffer->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start[row] = 1.0;
  row_ep_buffer->packFlag = true;
  HEkk::btran(&this->ekk_instance_,row_ep_buffer,(this->ekk_instance_).info_.row_ep_density);
  return kOk;
}

Assistant:

HighsStatus Highs::getBasisInverseRowSparse(const HighsInt row,
                                            HVector& row_ep_buffer) {
  ekk_instance_.setNlaPointersForLpAndScale(model_.lp_);
  row_ep_buffer.clear();
  row_ep_buffer.count = 1;
  row_ep_buffer.index[0] = row;
  row_ep_buffer.array[row] = 1;
  row_ep_buffer.packFlag = true;

  ekk_instance_.btran(row_ep_buffer, ekk_instance_.info_.row_ep_density);

  return HighsStatus::kOk;
}